

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O1

void __thiscall DIS::EnvironmentType::EnvironmentType(EnvironmentType *this)

{
  this->_vptr_EnvironmentType = (_func_int **)&PTR__EnvironmentType_001b48a0;
  this->_entityKind = '\0';
  this->_domain = '\0';
  this->_entityClass = 0;
  this->_category = '\0';
  this->_subcategory = '\0';
  this->_specific = '\0';
  this->_extra = '\0';
  return;
}

Assistant:

EnvironmentType::EnvironmentType():
   _entityKind(0), 
   _domain(0), 
   _entityClass(0), 
   _category(0), 
   _subcategory(0), 
   _specific(0), 
   _extra(0)
{
}